

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

void utrie_enum_63(UTrie *trie,UTrieEnumValue *enumValue,UTrieEnumRange *enumRange,void *context)

{
  uint16_t *puVar1;
  uint32_t *puVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar8;
  uint local_94;
  uint32_t local_80;
  uint local_7c;
  int local_64;
  int32_t offset;
  int32_t nullBlock;
  int32_t prevBlock;
  int32_t block;
  int32_t j;
  int32_t i;
  int32_t l;
  UChar32 prev;
  UChar32 c;
  uint32_t initialValue;
  uint32_t prevValue;
  uint32_t value;
  uint16_t *idx;
  uint32_t *data32;
  void *context_local;
  UTrieEnumRange *enumRange_local;
  UTrieEnumValue *enumValue_local;
  UTrie *trie_local;
  
  if (((trie != (UTrie *)0x0) && (trie->index != (uint16_t *)0x0)) &&
     (enumRange != (UTrieEnumRange *)0x0)) {
    enumRange_local = (UTrieEnumRange *)enumValue;
    if (enumValue == (UTrieEnumValue *)0x0) {
      enumRange_local = enumSameValue;
    }
    puVar1 = trie->index;
    puVar2 = trie->data32;
    UVar3 = (*enumRange_local)(context,trie->initialValue,(UChar32)enumRange,(uint32_t)trie);
    iVar4 = (int)CONCAT71(extraout_var,UVar3);
    if (puVar2 == (uint32_t *)0x0) {
      local_64 = trie->indexLength;
    }
    else {
      local_64 = 0;
    }
    offset = local_64;
    i = 0;
    block = 0;
    l = 0;
    uVar8 = extraout_RDX;
    c = iVar4;
    while (l < 0x10000) {
      if (l == 0xd800) {
        block = 0x800;
      }
      else if (l == 0xdc00) {
        block = 0x6e0;
      }
      iVar6 = (uint)puVar1[block] * 4;
      if (iVar6 == offset) {
        l = l + 0x20;
      }
      else if (iVar6 == local_64) {
        if (c != iVar4) {
          if ((i < l) &&
             (UVar3 = (*enumRange)(context,i,l,c), uVar8 = extraout_RDX_00, UVar3 == '\0')) {
            return;
          }
          offset = local_64;
          i = l;
          c = iVar4;
        }
        l = l + 0x20;
      }
      else {
        offset = iVar6;
        for (prevBlock = 0; prevBlock < 0x20; prevBlock = prevBlock + 1) {
          if (puVar2 == (uint32_t *)0x0) {
            local_7c = (uint)puVar1[iVar6 + prevBlock];
          }
          else {
            local_7c = puVar2[iVar6 + prevBlock];
          }
          UVar3 = (*enumRange_local)(context,local_7c,(UChar32)uVar8,iVar6 + prevBlock);
          iVar5 = (int)CONCAT71(extraout_var_00,UVar3);
          uVar8 = extraout_RDX_01;
          if (iVar5 != c) {
            if ((i < l) &&
               (UVar3 = (*enumRange)(context,i,l,c), uVar8 = extraout_RDX_02, UVar3 == '\0')) {
              return;
            }
            if (0 < prevBlock) {
              offset = -1;
            }
            i = l;
            c = iVar5;
          }
          l = l + 1;
        }
      }
      block = block + 1;
    }
    j = 0xd800;
    while (j < 0xdc00) {
      iVar6 = (uint)puVar1[j >> 5] * 4;
      if (iVar6 == local_64) {
        if (c != iVar4) {
          if ((i < l) && (UVar3 = (*enumRange)(context,i,l,c), UVar3 == '\0')) {
            return;
          }
          offset = local_64;
          i = l;
          c = iVar4;
        }
        j = j + 0x20;
        l = l + 0x8000;
      }
      else {
        if (puVar2 == (uint32_t *)0x0) {
          local_80 = (uint32_t)puVar1[(int)(iVar6 + (j & 0x1fU))];
        }
        else {
          local_80 = puVar2[(int)(iVar6 + (j & 0x1fU))];
        }
        block = (*trie->getFoldingOffset)(local_80);
        if (block < 1) {
          if (c != iVar4) {
            if ((i < l) && (UVar3 = (*enumRange)(context,i,l,c), UVar3 == '\0')) {
              return;
            }
            offset = local_64;
            i = l;
            c = iVar4;
          }
          l = l + 0x400;
        }
        else {
          iVar6 = block + 0x20;
          uVar8 = extraout_RDX_03;
          do {
            iVar5 = (uint)puVar1[block] * 4;
            if (iVar5 == offset) {
              l = l + 0x20;
            }
            else if (iVar5 == local_64) {
              if (c != iVar4) {
                if ((i < l) &&
                   (UVar3 = (*enumRange)(context,i,l,c), uVar8 = extraout_RDX_04, UVar3 == '\0')) {
                  return;
                }
                offset = local_64;
                i = l;
                c = iVar4;
              }
              l = l + 0x20;
            }
            else {
              offset = iVar5;
              for (prevBlock = 0; prevBlock < 0x20; prevBlock = prevBlock + 1) {
                if (puVar2 == (uint32_t *)0x0) {
                  local_94 = (uint)puVar1[iVar5 + prevBlock];
                }
                else {
                  local_94 = puVar2[iVar5 + prevBlock];
                }
                UVar3 = (*enumRange_local)(context,local_94,(UChar32)uVar8,iVar5 + prevBlock);
                iVar7 = (int)CONCAT71(extraout_var_01,UVar3);
                uVar8 = extraout_RDX_05;
                if (iVar7 != c) {
                  if ((i < l) &&
                     (UVar3 = (*enumRange)(context,i,l,c), uVar8 = extraout_RDX_06, UVar3 == '\0'))
                  {
                    return;
                  }
                  if (0 < prevBlock) {
                    offset = -1;
                  }
                  i = l;
                  c = iVar7;
                }
                l = l + 1;
              }
            }
            block = block + 1;
          } while (block < iVar6);
        }
        j = j + 1;
      }
    }
    (*enumRange)(context,i,l,c);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utrie_enum(const UTrie *trie,
           UTrieEnumValue *enumValue, UTrieEnumRange *enumRange, const void *context) {
    const uint32_t *data32;
    const uint16_t *idx;

    uint32_t value, prevValue, initialValue;
    UChar32 c, prev;
    int32_t l, i, j, block, prevBlock, nullBlock, offset;

    /* check arguments */
    if(trie==NULL || trie->index==NULL || enumRange==NULL) {
        return;
    }
    if(enumValue==NULL) {
        enumValue=enumSameValue;
    }

    idx=trie->index;
    data32=trie->data32;

    /* get the enumeration value that corresponds to an initial-value trie data entry */
    initialValue=enumValue(context, trie->initialValue);

    if(data32==NULL) {
        nullBlock=trie->indexLength;
    } else {
        nullBlock=0;
    }

    /* set variables for previous range */
    prevBlock=nullBlock;
    prev=0;
    prevValue=initialValue;

    /* enumerate BMP - the main loop enumerates data blocks */
    for(i=0, c=0; c<=0xffff; ++i) {
        if(c==0xd800) {
            /* skip lead surrogate code _units_, go to lead surr. code _points_ */
            i=UTRIE_BMP_INDEX_LENGTH;
        } else if(c==0xdc00) {
            /* go back to regular BMP code points */
            i=c>>UTRIE_SHIFT;
        }

        block=idx[i]<<UTRIE_INDEX_SHIFT;
        if(block==prevBlock) {
            /* the block is the same as the previous one, and filled with value */
            c+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(block==nullBlock) {
            /* this is the all-initial-value block */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }
            c+=UTRIE_DATA_BLOCK_LENGTH;
        } else {
            prevBlock=block;
            for(j=0; j<UTRIE_DATA_BLOCK_LENGTH; ++j) {
                value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                if(value!=prevValue) {
                    if(prev<c) {
                        if(!enumRange(context, prev, c, prevValue)) {
                            return;
                        }
                    }
                    if(j>0) {
                        /* the block is not filled with all the same value */
                        prevBlock=-1;
                    }
                    prev=c;
                    prevValue=value;
                }
                ++c;
            }
        }
    }

    /* enumerate supplementary code points */
    for(l=0xd800; l<0xdc00;) {
        /* lead surrogate access */
        offset=idx[l>>UTRIE_SHIFT]<<UTRIE_INDEX_SHIFT;
        if(offset==nullBlock) {
            /* no entries for a whole block of lead surrogates */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }

            l+=UTRIE_DATA_BLOCK_LENGTH;
            c+=UTRIE_DATA_BLOCK_LENGTH<<10;
            continue;
        }

        value= data32!=NULL ? data32[offset+(l&UTRIE_MASK)] : idx[offset+(l&UTRIE_MASK)];

        /* enumerate trail surrogates for this lead surrogate */
        offset=trie->getFoldingOffset(value);
        if(offset<=0) {
            /* no data for this lead surrogate */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }

            /* nothing else to do for the supplementary code points for this lead surrogate */
            c+=0x400;
        } else {
            /* enumerate code points for this lead surrogate */
            i=offset;
            offset+=UTRIE_SURROGATE_BLOCK_COUNT;
            do {
                /* copy of most of the body of the BMP loop */
                block=idx[i]<<UTRIE_INDEX_SHIFT;
                if(block==prevBlock) {
                    /* the block is the same as the previous one, and filled with value */
                    c+=UTRIE_DATA_BLOCK_LENGTH;
                } else if(block==nullBlock) {
                    /* this is the all-initial-value block */
                    if(prevValue!=initialValue) {
                        if(prev<c) {
                            if(!enumRange(context, prev, c, prevValue)) {
                                return;
                            }
                        }
                        prevBlock=nullBlock;
                        prev=c;
                        prevValue=initialValue;
                    }
                    c+=UTRIE_DATA_BLOCK_LENGTH;
                } else {
                    prevBlock=block;
                    for(j=0; j<UTRIE_DATA_BLOCK_LENGTH; ++j) {
                        value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                        if(value!=prevValue) {
                            if(prev<c) {
                                if(!enumRange(context, prev, c, prevValue)) {
                                    return;
                                }
                            }
                            if(j>0) {
                                /* the block is not filled with all the same value */
                                prevBlock=-1;
                            }
                            prev=c;
                            prevValue=value;
                        }
                        ++c;
                    }
                }
            } while(++i<offset);
        }

        ++l;
    }

    /* deliver last range */
    enumRange(context, prev, c, prevValue);
}